

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O2

string * __thiscall
cmCPackIFWPackage::GetComponentName_abi_cxx11_
          (string *__return_storage_ptr__,cmCPackIFWPackage *this,cmCPackComponent *component)

{
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  if (component == (cmCPackComponent *)0x0) {
    __s = "";
  }
  else {
    cmsys::SystemTools::UpperCase(&local_40,&component->Name);
    std::operator+(&local_60,"CPACK_IFW_COMPONENT_",&local_40);
    std::operator+(&local_80,&local_60,"_NAME");
    __s = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    if (__s == (char *)0x0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)component);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackIFWPackage::GetComponentName(cmCPackComponent* component)
{
  if (!component) {
    return "";
  }
  const char* option =
    this->GetOption("CPACK_IFW_COMPONENT_" +
                    cmsys::SystemTools::UpperCase(component->Name) + "_NAME");
  return option ? option : component->Name;
}